

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

LinearSpace3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::BSplineCurveT>
::computeAlignedSpace
          (LinearSpace3fa *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::BSplineCurveT>
          *this,size_t primID)

{
  uint uVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  char *pcVar3;
  size_t sVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  vfloat4 a0_1;
  undefined1 auVar13 [16];
  vfloat4 a0;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar16;
  float fVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  undefined1 auVar19 [16];
  undefined1 auVar23 [12];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  
  pBVar2 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.vertices.
           items;
  uVar1 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   primID * *(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                      super_CurveGeometry.field_0x68);
  pcVar3 = (pBVar2->super_RawBufferView).ptr_ofs;
  sVar4 = (pBVar2->super_RawBufferView).stride;
  lVar7 = (uVar1 + 1) * sVar4;
  lVar8 = (uVar1 + 2) * sVar4;
  lVar6 = (uVar1 + 3) * sVar4;
  fVar17 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
           maxRadiusScale;
  auVar14 = vinsertps_avx(*(undefined1 (*) [16])(pcVar3 + uVar1 * sVar4),
                          ZEXT416((uint)(fVar17 * *(float *)(pcVar3 + uVar1 * sVar4 + 0xc))),0x30);
  auVar11 = vinsertps_avx(*(undefined1 (*) [16])(pcVar3 + lVar7),
                          ZEXT416((uint)(fVar17 * *(float *)(pcVar3 + lVar7 + 0xc))),0x30);
  auVar12 = vinsertps_avx(*(undefined1 (*) [16])(pcVar3 + lVar8),
                          ZEXT416((uint)(fVar17 * *(float *)(pcVar3 + lVar8 + 0xc))),0x30);
  auVar15 = vinsertps_avx(*(undefined1 (*) [16])(pcVar3 + lVar6),
                          ZEXT416((uint)(fVar17 * *(float *)(pcVar3 + lVar6 + 0xc))),0x30);
  auVar13._8_4_ = 0x3e2aaaab;
  auVar13._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar13._12_4_ = 0x3e2aaaab;
  auVar29._0_4_ = auVar12._0_4_ * 0.16666667;
  auVar29._4_4_ = auVar12._4_4_ * 0.16666667;
  auVar29._8_4_ = auVar12._8_4_ * 0.16666667;
  auVar29._12_4_ = auVar12._12_4_ * 0.16666667;
  auVar28._8_4_ = 0x3f2aaaab;
  auVar28._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar28._12_4_ = 0x3f2aaaab;
  auVar10 = vfmadd231ps_fma(auVar29,auVar11,auVar28);
  auVar10 = vfmadd231ps_fma(auVar10,auVar14,auVar13);
  auVar33._0_4_ = auVar15._0_4_ * 0.16666667;
  auVar33._4_4_ = auVar15._4_4_ * 0.16666667;
  auVar33._8_4_ = auVar15._8_4_ * 0.16666667;
  auVar33._12_4_ = auVar15._12_4_ * 0.16666667;
  auVar28 = vfmadd231ps_fma(auVar33,auVar12,auVar28);
  auVar28 = vfmadd231ps_fma(auVar28,auVar11,auVar13);
  auVar28 = vsubps_avx(auVar28,auVar10);
  auVar10 = vdpps_avx(auVar28,auVar28,0x7f);
  fVar24 = auVar10._0_4_;
  auVar10 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)fVar24));
  fVar17 = auVar10._0_4_;
  fVar17 = fVar17 * 1.5 + fVar24 * -0.5 * fVar17 * fVar17 * fVar17;
  auVar10._0_4_ = auVar28._0_4_ * fVar17;
  auVar10._4_4_ = auVar28._4_4_ * fVar17;
  auVar10._8_4_ = auVar28._8_4_ * fVar17;
  auVar10._12_4_ = auVar28._12_4_ * fVar17;
  if (1e-18 < fVar24) {
    auVar25._0_4_ = auVar15._0_4_ * 0.0;
    auVar25._4_4_ = auVar15._4_4_ * 0.0;
    auVar25._8_4_ = auVar15._8_4_ * 0.0;
    auVar25._12_4_ = auVar15._12_4_ * 0.0;
    auVar30._8_4_ = 0xbf000000;
    auVar30._0_8_ = 0xbf000000bf000000;
    auVar30._12_4_ = 0xbf000000;
    auVar12 = vfnmadd213ps_fma(auVar12,auVar30,auVar25);
    auVar11 = vfnmadd213ps_fma(auVar11,ZEXT816(0) << 0x20,auVar12);
    auVar12 = vfmadd213ps_fma(auVar14,auVar30,auVar11);
    auVar14 = vshufps_avx(auVar12,auVar12,0xc9);
    auVar11 = vshufps_avx(auVar10,auVar10,0xc9);
    auVar15._0_4_ = auVar12._0_4_ * auVar11._0_4_;
    auVar15._4_4_ = auVar12._4_4_ * auVar11._4_4_;
    auVar15._8_4_ = auVar12._8_4_ * auVar11._8_4_;
    auVar15._12_4_ = auVar12._12_4_ * auVar11._12_4_;
    auVar14 = vfmsub231ps_fma(auVar15,auVar10,auVar14);
    auVar14 = vshufps_avx(auVar14,auVar14,0xc9);
  }
  else {
    auVar14 = ZEXT816(0x3f80000000000000);
    auVar10 = _DAT_01fec700;
  }
  auVar11 = vdpps_avx(auVar14,auVar14,0x7f);
  fVar17 = auVar11._0_4_;
  if (fVar17 <= 1e-18) {
    auVar11 = vshufpd_avx(auVar10,auVar10,1);
    auVar14 = vmovshdup_avx(auVar10);
    auVar20._8_4_ = 0x80000000;
    auVar20._0_8_ = 0x8000000080000000;
    auVar20._12_4_ = 0x80000000;
    auVar19._0_4_ = auVar14._0_4_ ^ 0x80000000;
    auVar23 = ZEXT812(0) << 0x20;
    auVar28 = ZEXT816(0) << 0x40;
    auVar14 = vunpckhps_avx(auVar10,auVar28);
    auVar19._4_12_ = auVar23;
    auVar15 = vshufps_avx(auVar14,auVar19,0x41);
    auVar14 = vdpps_avx(auVar15,auVar15,0x7f);
    auVar12._0_8_ = auVar11._0_8_ ^ 0x8000000080000000;
    auVar12._8_8_ = auVar11._8_8_ ^ auVar20._8_8_;
    auVar12 = vinsertps_avx(auVar12,auVar10,0x2a);
    auVar11 = vdpps_avx(auVar12,auVar12,0x7f);
    uVar5 = vcmpps_avx512vl(auVar11,auVar14,1);
    auVar14 = vpmovm2d_avx512vl(uVar5);
    auVar14._4_4_ = auVar14._0_4_;
    auVar14._8_4_ = auVar14._0_4_;
    auVar14._12_4_ = auVar14._0_4_;
    uVar9 = vpmovd2m_avx512vl(auVar14);
    auVar14 = vpcmpeqd_avx(auVar14,auVar14);
    auVar11._4_4_ = (uint)((byte)(uVar9 >> 1) & 1) * auVar14._4_4_;
    auVar11._0_4_ = (uint)((byte)uVar9 & 1) * auVar14._0_4_;
    auVar11._8_4_ = (uint)((byte)(uVar9 >> 2) & 1) * auVar14._8_4_;
    auVar11._12_4_ = (uint)((byte)(uVar9 >> 3) & 1) * auVar14._12_4_;
    auVar14 = vblendvps_avx(auVar12,auVar15,auVar11);
    auVar11 = vdpps_avx(auVar14,auVar14,0x7f);
    auVar21._4_12_ = auVar23;
    auVar21._0_4_ = auVar11._0_4_;
    auVar12 = vrsqrt14ss_avx512f(auVar28,auVar21);
    fVar17 = auVar12._0_4_;
    fVar17 = fVar17 * 1.5 - auVar11._0_4_ * 0.5 * fVar17 * fVar17 * fVar17;
    aVar18._0_4_ = auVar14._0_4_ * fVar17;
    aVar18._4_4_ = auVar14._4_4_ * fVar17;
    aVar18._8_4_ = auVar14._8_4_ * fVar17;
    aVar18._12_4_ = auVar14._12_4_ * fVar17;
    auVar14 = vshufps_avx((undefined1  [16])aVar18,(undefined1  [16])aVar18,0xc9);
    auVar11 = vshufps_avx(auVar10,auVar10,0xc9);
    auVar22._0_4_ = aVar18._0_4_ * auVar11._0_4_;
    auVar22._4_4_ = aVar18._4_4_ * auVar11._4_4_;
    auVar22._8_4_ = aVar18._8_4_ * auVar11._8_4_;
    auVar22._12_4_ = aVar18._12_4_ * auVar11._12_4_;
    auVar14 = vfmsub231ps_fma(auVar22,auVar10,auVar14);
    auVar11 = vshufps_avx(auVar14,auVar14,0xc9);
    auVar14 = vdpps_avx(auVar11,auVar11,0x7f);
    auVar32._4_12_ = auVar23;
    auVar32._0_4_ = auVar14._0_4_;
    auVar12 = vrsqrt14ss_avx512f(auVar28,auVar32);
    fVar17 = auVar12._0_4_;
    fVar17 = fVar17 * 1.5 - auVar14._0_4_ * 0.5 * fVar17 * fVar17 * fVar17;
    aVar16._0_4_ = fVar17 * auVar11._0_4_;
    aVar16._4_4_ = fVar17 * auVar11._4_4_;
    aVar16._8_4_ = fVar17 * auVar11._8_4_;
    aVar16._12_4_ = fVar17 * auVar11._12_4_;
  }
  else {
    auVar23 = SUB1612(ZEXT416(0),0) << 0x20;
    auVar12 = ZEXT416(0) << 0x40;
    auVar26._4_12_ = auVar23;
    auVar26._0_4_ = fVar17;
    auVar11 = vrsqrt14ss_avx512f(auVar12,auVar26);
    fVar24 = auVar11._0_4_;
    fVar17 = fVar24 * 1.5 - fVar17 * 0.5 * fVar24 * fVar24 * fVar24;
    aVar16._0_4_ = auVar14._0_4_ * fVar17;
    aVar16._4_4_ = auVar14._4_4_ * fVar17;
    aVar16._8_4_ = auVar14._8_4_ * fVar17;
    aVar16._12_4_ = auVar14._12_4_ * fVar17;
    auVar14 = vshufps_avx(auVar10,auVar10,0xc9);
    auVar11 = vshufps_avx((undefined1  [16])aVar16,(undefined1  [16])aVar16,0xc9);
    auVar27._0_4_ = auVar10._0_4_ * auVar11._0_4_;
    auVar27._4_4_ = auVar10._4_4_ * auVar11._4_4_;
    auVar27._8_4_ = auVar10._8_4_ * auVar11._8_4_;
    auVar27._12_4_ = auVar10._12_4_ * auVar11._12_4_;
    auVar14 = vfmsub231ps_fma(auVar27,(undefined1  [16])aVar16,auVar14);
    auVar11 = vshufps_avx(auVar14,auVar14,0xc9);
    auVar14 = vdpps_avx(auVar11,auVar11,0x7f);
    auVar31._4_12_ = auVar23;
    auVar31._0_4_ = auVar14._0_4_;
    auVar12 = vrsqrt14ss_avx512f(auVar12,auVar31);
    fVar17 = auVar12._0_4_;
    fVar17 = fVar17 * 1.5 - auVar14._0_4_ * 0.5 * fVar17 * fVar17 * fVar17;
    aVar18._0_4_ = fVar17 * auVar11._0_4_;
    aVar18._4_4_ = fVar17 * auVar11._4_4_;
    aVar18._8_4_ = fVar17 * auVar11._8_4_;
    aVar18._12_4_ = fVar17 * auVar11._12_4_;
  }
  (__return_storage_ptr__->vx).field_0 = aVar18;
  (__return_storage_ptr__->vy).field_0 = aVar16;
  *(undefined1 (*) [16])(__return_storage_ptr__->vz).field_0.m128 = auVar10;
  return __return_storage_ptr__;
}

Assistant:

LinearSpace3fa computeAlignedSpace(const size_t primID) const
      {
        Vec3fa axisz(0,0,1);
        Vec3fa axisy(0,1,0);
        
        const Curve3ff curve = getCurveScaledRadius(primID);
        const Vec3fa p0 = curve.begin();
        const Vec3fa p3 = curve.end();
        const Vec3fa d0 = curve.eval_du(0.0f);
        //const Vec3fa d1 = curve.eval_du(1.0f);
        const Vec3fa axisz_ = normalize(p3 - p0);
        const Vec3fa axisy_ = cross(axisz_,d0);
        if (sqr_length(p3-p0) > 1E-18f) {
          axisz = axisz_;
          axisy = axisy_;
        }
        
        if (sqr_length(axisy) > 1E-18) {
          axisy = normalize(axisy);
          Vec3fa axisx = normalize(cross(axisy,axisz));
          return LinearSpace3fa(axisx,axisy,axisz);
        }
        return frame(axisz);
      }